

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_artifacts.cpp
# Opt level: O0

void __thiscall APowerRegeneration::DoEffect(APowerRegeneration *this)

{
  bool bVar1;
  AActor *pAVar2;
  FSoundID local_14;
  APowerRegeneration *local_10;
  APowerRegeneration *this_local;
  
  local_10 = this;
  APowerup::DoEffect(&this->super_APowerup);
  bVar1 = TObjPtr<AActor>::operator!=(&(this->super_APowerup).super_AInventory.Owner,(AActor *)0x0);
  if (((bVar1) &&
      (pAVar2 = TObjPtr<AActor>::operator->(&(this->super_APowerup).super_AInventory.Owner),
      0 < pAVar2->health)) && ((::level.time & 0x1fU) == 0)) {
    pAVar2 = ::TObjPtr::operator_cast_to_AActor_
                       ((TObjPtr *)&(this->super_APowerup).super_AInventory.Owner);
    bVar1 = P_GiveBody(pAVar2,(int)(this->super_APowerup).Strength,0);
    if (bVar1) {
      pAVar2 = ::TObjPtr::operator_cast_to_AActor_
                         ((TObjPtr *)&(this->super_APowerup).super_AInventory.Owner);
      FSoundID::FSoundID(&local_14,"*regenerate");
      S_Sound(pAVar2,3,&local_14,1.0,1.0);
    }
  }
  return;
}

Assistant:

void APowerRegeneration::DoEffect()
{
	Super::DoEffect();
	if (Owner != NULL && Owner->health > 0 && (level.time & 31) == 0)
	{
		if (P_GiveBody(Owner, int(Strength)))
		{
			S_Sound(Owner, CHAN_ITEM, "*regenerate", 1, ATTN_NORM );
		}
	}
}